

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O2

void __thiscall
cbtBoxShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (cbtBoxShape *this,cbtVector3 *vectors,cbtVector3 *supportVerticesOut,int numVectors)

{
  cbtScalar cVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  
  for (lVar6 = 0; (ulong)(uint)(~(numVectors >> 0x1f) & numVectors) << 4 != lVar6;
      lVar6 = lVar6 + 0x10) {
    cVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
            m_implicitShapeDimensions.m_floats[2];
    uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                           ZEXT416(*(uint *)((long)vectors->m_floats + lVar6 + 8)),2);
    bVar5 = (bool)((byte)uVar4 & 1);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)((long)vectors->m_floats + lVar6);
    uVar4 = *(undefined8 *)
             (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
             m_implicitShapeDimensions.m_floats;
    uVar8 = (uint)uVar4;
    uVar9 = (uint)((ulong)uVar4 >> 0x20);
    uVar3 = vcmpps_avx512vl(ZEXT816(0) << 0x40,auVar10,2);
    bVar2 = (bool)((byte)uVar3 & 1);
    auVar7._0_4_ = bVar2 * uVar8 | (uint)!bVar2 * (uVar8 ^ 0x80000000);
    bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar7._4_4_ = bVar2 * uVar9 | (uint)!bVar2 * (uVar9 ^ 0x80000000);
    auVar7._8_4_ = (uint)!(bool)((byte)(uVar3 >> 2) & 1) * -0x80000000;
    auVar7._12_4_ = (uint)!(bool)((byte)(uVar3 >> 3) & 1) * -0x80000000;
    uVar4 = vmovlps_avx(auVar7);
    *(undefined8 *)((long)supportVerticesOut->m_floats + lVar6) = uVar4;
    *(uint *)((long)supportVerticesOut->m_floats + lVar6 + 8) =
         (uint)bVar5 * (int)cVar1 + (uint)!bVar5 * (int)-cVar1;
    *(undefined4 *)((long)supportVerticesOut->m_floats + lVar6 + 0xc) = 0;
  }
  return;
}

Assistant:

virtual void batchedUnitVectorGetSupportingVertexWithoutMargin(const cbtVector3* vectors, cbtVector3* supportVerticesOut, int numVectors) const
	{
		const cbtVector3& halfExtents = getHalfExtentsWithoutMargin();

		for (int i = 0; i < numVectors; i++)
		{
			const cbtVector3& vec = vectors[i];
			supportVerticesOut[i].setValue(cbtFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
										   cbtFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
										   cbtFsels(vec.z(), halfExtents.z(), -halfExtents.z()));
		}
	}